

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.c
# Opt level: O0

DeferredSocketOpener *
local_proxy_opener(SockAddr *addr,int port,Plug *plug,Conf *conf,Interactor *itr)

{
  void *__s;
  SockAddr *pSVar1;
  Conf *pCVar2;
  LogPolicy *pLVar3;
  Seat *pSVar4;
  LocalProxyOpener *lp;
  Interactor *itr_local;
  Conf *conf_local;
  Plug *plug_local;
  int port_local;
  SockAddr *addr_local;
  
  __s = safemalloc(1,0x80,0);
  memset(__s,0,0x80);
  *(Plug **)((long)__s + 0x18) = plug;
  *(DeferredSocketOpenerVtable **)((long)__s + 0x78) = &LocalProxyOpener_openervt;
  *(InteractorVtable **)((long)__s + 0x60) = &LocalProxyOpener_interactorvt;
  pSVar1 = sk_addr_dup(addr);
  *(SockAddr **)((long)__s + 0x20) = pSVar1;
  *(int *)((long)__s + 0x28) = port;
  pCVar2 = conf_copy(conf);
  *(Conf **)((long)__s + 0x30) = pCVar2;
  if (itr != (Interactor *)0x0) {
    *(Interactor **)((long)__s + 0x38) = itr;
    interactor_set_child(*(Interactor **)((long)__s + 0x38),(Interactor *)((long)__s + 0x60));
    pLVar3 = interactor_logpolicy(*(Interactor **)((long)__s + 0x38));
    *(LogPolicy **)((long)__s + 0x40) = pLVar3;
    pSVar4 = interactor_borrow_seat(*(Interactor **)((long)__s + 0x38));
    *(Seat **)((long)__s + 0x48) = pSVar4;
  }
  return (DeferredSocketOpener *)((long)__s + 0x78);
}

Assistant:

DeferredSocketOpener *local_proxy_opener(
    SockAddr *addr, int port, Plug *plug, Conf *conf, Interactor *itr)
{
    LocalProxyOpener *lp = snew(LocalProxyOpener);
    memset(lp, 0, sizeof(*lp));
    lp->plug = plug;
    lp->opener.vt = &LocalProxyOpener_openervt;
    lp->interactor.vt = &LocalProxyOpener_interactorvt;
    lp->addr = sk_addr_dup(addr);
    lp->port = port;
    lp->conf = conf_copy(conf);

    if (itr) {
        lp->clientitr = itr;
        interactor_set_child(lp->clientitr, &lp->interactor);
        lp->clientlp = interactor_logpolicy(lp->clientitr);
        lp->clientseat = interactor_borrow_seat(lp->clientitr);
    }

    return &lp->opener;
}